

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O0

gchar * g_array_free(GArray *farray,gboolean free_segment)

{
  gchar *pgVar1;
  ArrayFreeFlags flags;
  GRealArray *array;
  gboolean free_segment_local;
  GArray *farray_local;
  
  pgVar1 = array_free((GRealArray *)farray,free_segment != 0 | PRESERVE_WRAPPER);
  return pgVar1;
}

Assistant:

gchar *g_array_free (GArray   *farray,
        gboolean  free_segment)
{
    GRealArray *array = (GRealArray*) farray;
    ArrayFreeFlags flags;

    g_return_val_if_fail (array, NULL);

    flags = (free_segment ? FREE_SEGMENT : 0);

    /* if others are holding a reference, preserve the wrapper but do free/return the data */
    //if (!g_atomic_ref_count_dec (&array->ref_count))
    flags |= PRESERVE_WRAPPER;

    return array_free (array, flags);
}